

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool __thiscall
bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::MaybeGrow
          (Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this)

{
  ulong uVar1;
  size_t sVar2;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar3;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar4;
  long lVar5;
  bool bVar6;
  int line;
  size_t sVar7;
  
  uVar1 = this->capacity_;
  bVar6 = true;
  if (this->size_ < uVar1) {
    return true;
  }
  if (uVar1 == 0) {
    sVar7 = 0x10;
LAB_00238952:
    puVar4 = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)OPENSSL_malloc(sVar7 * 8)
    ;
    if (puVar4 == (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x0) {
      bVar6 = false;
    }
    else {
      sVar2 = this->size_;
      if (sVar2 != 0) {
        puVar3 = this->data_;
        lVar5 = 0;
        do {
          *(undefined8 *)
           ((long)&(puVar4->_M_t).
                   super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl + lVar5) =
               *(undefined8 *)
                ((long)&(puVar3->_M_t).
                        super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl + lVar5);
          *(undefined8 *)
           ((long)&(puVar3->_M_t).
                   super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl + lVar5) = 0;
          lVar5 = lVar5 + 8;
        } while (sVar2 * 8 - lVar5 != 0);
      }
      clear(this);
      this->data_ = puVar4;
      this->size_ = sVar2;
      this->capacity_ = sVar7;
    }
  }
  else {
    if ((long)uVar1 < 0) {
      line = 0x14d;
    }
    else {
      if (uVar1 >> 0x3c == 0) {
        sVar7 = uVar1 * 2;
        goto LAB_00238952;
      }
      line = 0x153;
    }
    bVar6 = false;
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                  ,line);
  }
  return bVar6;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }